

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledHorizontal.cpp
# Opt level: O2

SharedPtr<Decorator> __thiscall
Rml::DecoratorTiledHorizontalInstancer::InstanceDecorator
          (DecoratorTiledHorizontalInstancer *this,String *param_1,PropertyDictionary *properties,
          DecoratorInstancerInterface *instancer_interface)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  DecoratorInstancerInterface *in_R8;
  long lVar3;
  SharedPtr<Decorator> SVar4;
  SharedPtr<Rml::DecoratorTiledHorizontal> decorator;
  Texture textures [3];
  Tile tiles [3];
  
  lVar3 = 0;
  do {
    DecoratorTiled::Tile::Tile
              ((Tile *)((long)(&((Tile *)(&((Tile *)(&tiles[0].tile_data + -1))->tile_data + -1))->
                                tile_data + 0xffffffffffffffff) + lVar3));
    lVar3 = lVar3 + 0x4c;
  } while (lVar3 != 0xe4);
  lVar3 = 0xc;
  do {
    *(undefined8 *)((long)textures + lVar3 + -0xc) = 0;
    *(undefined8 *)((long)textures + lVar3 + -4) = 0xffffffffffffffff;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x3c);
  bVar1 = DecoratorTiledInstancer::GetTileProperties
                    ((DecoratorTiledInstancer *)param_1,tiles,textures,3,
                     (PropertyDictionary *)instancer_interface,in_R8);
  if (bVar1) {
    ::std::make_shared<Rml::DecoratorTiledHorizontal>();
    bVar1 = DecoratorTiledHorizontal::Initialise
                      (decorator.
                       super___shared_ptr<Rml::DecoratorTiledHorizontal,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,tiles,textures);
    _Var2 = decorator.super___shared_ptr<Rml::DecoratorTiledHorizontal,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    if (bVar1) {
      decorator.super___shared_ptr<Rml::DecoratorTiledHorizontal,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->super_DecoratorTiledInstancer).super_DecoratorInstancer._vptr_DecoratorInstancer =
           (_func_int **)
           decorator.super___shared_ptr<Rml::DecoratorTiledHorizontal,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      (this->super_DecoratorTiledInstancer).super_DecoratorInstancer.super_EffectSpecification.
      properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var2._M_pi;
      decorator.super___shared_ptr<Rml::DecoratorTiledHorizontal,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
    }
    else {
      (this->super_DecoratorTiledInstancer).super_DecoratorInstancer._vptr_DecoratorInstancer =
           (_func_int **)0x0;
      (this->super_DecoratorTiledInstancer).super_DecoratorInstancer.super_EffectSpecification.
      properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&decorator.
                super___shared_ptr<Rml::DecoratorTiledHorizontal,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    (this->super_DecoratorTiledInstancer).super_DecoratorInstancer._vptr_DecoratorInstancer =
         (_func_int **)0x0;
    (this->super_DecoratorTiledInstancer).super_DecoratorInstancer.super_EffectSpecification.
    properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var2._M_pi = extraout_RDX;
  }
  SVar4.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  SVar4.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar4.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorTiledHorizontalInstancer::InstanceDecorator(const String& /*name*/, const PropertyDictionary& properties,
	const DecoratorInstancerInterface& instancer_interface)
{
	constexpr size_t num_tiles = 3;

	DecoratorTiled::Tile tiles[num_tiles];
	Texture textures[num_tiles];

	if (!GetTileProperties(tiles, textures, num_tiles, properties, instancer_interface))
		return nullptr;

	auto decorator = MakeShared<DecoratorTiledHorizontal>();
	if (!decorator->Initialise(tiles, textures))
		return nullptr;

	return decorator;
}